

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_lcp_2way_unstable<true>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  uchar *puVar1;
  lcp_t *plVar2;
  int iVar3;
  lcp_t *plVar4;
  lcp_t *plVar5;
  uchar **ppuVar6;
  long lVar7;
  size_t __n;
  uchar **__dest;
  uchar **ppuVar8;
  char *__assertion;
  lcp_t lVar9;
  uchar **ppuVar10;
  lcp_t *plVar11;
  bool bVar12;
  lcp_t *local_80;
  lcp_t local_78;
  size_t local_70;
  lcp_t local_40;
  int local_38;
  
  check_input(from0,lcp_input0,n0);
  check_input(from1,lcp_input1,n1);
  compare((uchar *)&local_40,*from0,(size_t)*from1);
  if (local_38 < 1) {
    puVar1 = *from0;
    from0 = from0 + 1;
    *result = puVar1;
    local_78 = *lcp_input0;
    local_80 = lcp_input0 + 1;
    local_70 = n0 - 1;
    plVar2 = lcp_input1;
    __dest = result + 1;
    lVar9 = local_40;
  }
  else {
    *result = *from1;
    __dest = result + 1;
    local_70 = n0;
    local_78 = local_40;
    local_80 = lcp_input0;
    if (n1 - 1 == 0) {
LAB_001ca6fc:
      if (local_70 == 0) {
        return;
      }
LAB_001ca701:
      __n = local_70 << 3;
      memmove(__dest,from0,__n);
      *lcp_result = local_78;
      goto LAB_001ca721;
    }
    plVar2 = lcp_input1 + 1;
    from1 = from1 + 1;
    lVar9 = *lcp_input1;
    n1 = n1 - 1;
  }
LAB_001ca402:
  do {
    plVar11 = lcp_result;
    ppuVar8 = __dest;
    ppuVar6 = from1;
    plVar5 = plVar2;
    lVar7 = 0;
    plVar4 = plVar11;
    ppuVar10 = ppuVar8;
    while( true ) {
      check_lcps(*(uchar **)((long)ppuVar8 + lVar7 + -8),*from0,local_78,
                 *(uchar **)((long)ppuVar6 + lVar7),lVar9);
      if (lVar9 < local_78) break;
      if (lVar9 <= local_78) {
        compare((uchar *)&local_40,*from0,*(size_t *)((long)ppuVar6 + lVar7));
        lVar9 = local_40;
        if (local_38 < 0) {
          *(uchar **)((long)ppuVar8 + lVar7) = *from0;
          *(lcp_t *)((long)plVar11 + lVar7) = local_78;
          local_70 = local_70 - 1;
          if (local_70 == 0) goto LAB_001ca746;
          from0 = from0 + 1;
          local_78 = *local_80;
          local_80 = local_80 + 1;
          plVar2 = (lcp_t *)((long)plVar5 + lVar7);
          from1 = (uchar **)((long)ppuVar6 + lVar7);
          __dest = (uchar **)((long)ppuVar8 + lVar7 + 8);
          lcp_result = (lcp_t *)((long)plVar11 + lVar7 + 8);
          goto LAB_001ca402;
        }
        if (local_38 != 0) {
          *(undefined8 *)((long)ppuVar8 + lVar7) = *(undefined8 *)((long)ppuVar6 + lVar7);
          *(lcp_t *)((long)plVar11 + lVar7) = local_78;
          if (n1 == 1) {
            __dest = (uchar **)((long)ppuVar8 + lVar7 + 8);
            lcp_result = (lcp_t *)((long)plVar11 + lVar7 + 8);
            local_78 = local_40;
            goto LAB_001ca6fc;
          }
          plVar2 = (lcp_t *)((long)plVar5 + lVar7) + 1;
          from1 = (uchar **)((long)ppuVar6 + lVar7 + 8);
          __dest = (uchar **)((long)ppuVar8 + lVar7 + 8);
          lVar9 = *(lcp_t *)((long)plVar5 + lVar7);
          lcp_result = (lcp_t *)((long)plVar11 + lVar7 + 8);
          n1 = n1 - 1;
          local_78 = local_40;
          goto LAB_001ca402;
        }
        iVar3 = cmp(*from0,*(void **)((long)ppuVar6 + lVar7));
        if (iVar3 != 0) {
          __assert_fail("cmp(*from0, *from1)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x664,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                       );
        }
        if (local_70 == 0) {
          __assertion = "n0";
        }
        else {
          if (n1 != 0) {
            *(lcp_t *)((long)plVar11 + lVar7) = local_78;
            *(lcp_t *)((long)plVar11 + lVar7 + 8) = lVar9;
            *(uchar **)((long)ppuVar8 + lVar7) = *from0;
            *(undefined8 *)((long)ppuVar8 + lVar7 + 8) = *(undefined8 *)((long)ppuVar6 + lVar7);
            lVar9 = *(lcp_t *)((long)plVar5 + lVar7);
            local_70 = local_70 - 1;
            if (local_70 == 0) {
              n1 = n1 - 1;
              ppuVar8 = (uchar **)((long)ppuVar8 + lVar7 + 0x10);
              lcp_result = (lcp_t *)((long)plVar11 + lVar7 + 0x10);
              lVar7 = lVar7 + 8;
              goto LAB_001ca74c;
            }
            local_78 = *local_80;
            local_80 = local_80 + 1;
            from0 = from0 + 1;
            bVar12 = n1 != 1;
            plVar2 = (lcp_t *)((long)plVar5 + lVar7 + 8);
            from1 = (uchar **)((long)ppuVar6 + lVar7 + 8);
            __dest = (uchar **)((long)ppuVar8 + lVar7 + 0x10);
            lcp_result = (lcp_t *)((long)plVar11 + lVar7 + 0x10);
            n1 = n1 - 1;
            if (bVar12) goto LAB_001ca402;
            __dest = (uchar **)((long)ppuVar8 + lVar7 + 0x10);
            lcp_result = (lcp_t *)((long)plVar11 + lVar7 + 0x10);
            goto LAB_001ca701;
          }
          __assertion = "n1";
        }
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x665,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                     );
      }
      iVar3 = cmp(*from0,*(void **)((long)ppuVar6 + lVar7));
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x655,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                     );
      }
      ppuVar10 = ppuVar10 + 1;
      *(undefined8 *)((long)ppuVar8 + lVar7) = *(undefined8 *)((long)ppuVar6 + lVar7);
      plVar4 = plVar4 + 1;
      *(lcp_t *)((long)plVar11 + lVar7) = lVar9;
      lVar9 = *(lcp_t *)((long)plVar5 + lVar7);
      lVar7 = lVar7 + 8;
      n1 = n1 - 1;
      if (n1 == 0) {
        __dest = (uchar **)((long)ppuVar8 + lVar7);
        lcp_result = (lcp_t *)((long)plVar11 + lVar7);
        goto LAB_001ca6fc;
      }
    }
    iVar3 = cmp(*from0,*(void **)((long)ppuVar6 + lVar7));
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x64f,
                    "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = true]"
                   );
    }
    puVar1 = *from0;
    from0 = from0 + 1;
    *(undefined8 *)((long)ppuVar8 + lVar7) = puVar1;
    lcp_result = (lcp_t *)((long)plVar11 + lVar7 + 8);
    lcp_result[-1] = local_78;
    local_78 = *local_80;
    local_80 = local_80 + 1;
    local_70 = local_70 - 1;
    plVar2 = (lcp_t *)((long)plVar5 + lVar7);
    from1 = (uchar **)((long)ppuVar6 + lVar7);
    __dest = (uchar **)((undefined8 *)((long)ppuVar8 + lVar7) + 1);
  } while (local_70 != 0);
LAB_001ca746:
  ppuVar8 = ppuVar10 + 1;
  lcp_result = plVar4 + 1;
LAB_001ca74c:
  local_80 = (lcp_t *)((long)plVar5 + lVar7);
  if (n1 == 0) {
    return;
  }
  __n = n1 << 3;
  memmove(ppuVar8,(void *)((long)ppuVar6 + lVar7),__n);
  *lcp_result = lVar9;
LAB_001ca721:
  memmove(lcp_result + 1,local_80,__n);
  return;
}

Assistant:

static void
merge_lcp_2way_unstable(
               unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	check_input(from0, lcp_input0, n0);
	check_input(from1, lcp_input1, n1);
	lcp_t lcp0=0, lcp1=0;
	int cmp01; lcp_t lcp01;
	std::tie(cmp01, lcp01) = compare(*from0, *from1);
	if (cmp01 <= 0) {
		*result++ = *from0++;
		lcp0 = *lcp_input0++;
		lcp1 = lcp01;
		if (--n0 == 0) goto finish0;
	} else {
		*result++ = *from1++;
		lcp1 = *lcp_input1++;
		lcp0 = lcp01;
		if (--n1 == 0) goto finish1;
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '" <<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		check_lcps(*(result-1),*from0,lcp0,*from1,lcp1);
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (cmp01 < 0) {
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else if (cmp01 == 0) {
				assert(cmp(*from0, *from1)==0);
				assert(n0); assert(n1);
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *lcp_result++ = lcp01;
				*result++ = *from0++;
				*result++ = *from1++;
				--n0;
				--n1;
				lcp0 = *lcp_input0++;
				lcp1 = *lcp_input1++;
				if (n0 == 0) goto finish0;
				if (n1 == 0) goto finish1;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	if (n1) {
		std::copy(from1, from1+n1, result);
		if (OutputLCP) *lcp_result++ = lcp1;
		if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	}
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	if (n0) {
		std::copy(from0, from0+n0, result);
		if (OutputLCP) *lcp_result++ = lcp0;
		if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	}
	return;
}